

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariableStackFrame.cpp
# Opt level: O3

bool __thiscall
Jinx::Impl::VariableStackFrame::VariableAssign(VariableStackFrame *this,String *name)

{
  pointer pFVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
  *p_Var2;
  iterator iVar3;
  size_t sVar4;
  char *__s;
  size_type __len1;
  size_type __len2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
  *p_Var5;
  
  pFVar1 = (this->m_frames).
           super__Vector_base<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->m_frames).
      super__Vector_base<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
      ._M_impl.super__Vector_impl_data._M_start == pFVar1) {
    __len1 = (this->m_errorMessage)._M_string_length;
    __s = "Unexpected empty variable frame";
    __len2 = 0x1f;
  }
  else {
    p_Var5 = *(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
               **)&pFVar1[-1].stack.
                   super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>
                   ._M_impl.field_0x8;
    if (*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
          **)&pFVar1[-1].stack.
              super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>
              ._M_impl != p_Var5) {
      do {
        if (p_Var5 == *(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
                        **)&pFVar1[-1].stack.
                            super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>
                            ._M_impl) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>>,Jinx::Allocator<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>>>
          ::
          _M_insert_unique<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const&>
                    ((_Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>>,Jinx::Allocator<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>>>
                      *)(*(long *)&pFVar1[-1].stack.
                                   super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>
                                   ._M_impl.field_0x8 + -0x30),name);
          sVar4 = GetNamePartCount(name);
          pFVar1 = (this->m_frames).
                   super__Vector_base<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (sVar4 <= pFVar1[-1].maxVariableParts) {
            return true;
          }
          pFVar1[-1].maxVariableParts = sVar4;
          return true;
        }
        iVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
                ::find(p_Var5 + -1,name);
        p_Var2 = p_Var5 + -1;
        p_Var5 = p_Var5 + -1;
      } while ((_Rb_tree_header *)iVar3._M_node == &(p_Var2->_M_impl).super__Rb_tree_header);
      return true;
    }
    __len1 = (this->m_errorMessage)._M_string_length;
    __s = "Attempting to assign a variable to an empty stack";
    __len2 = 0x31;
  }
  std::__cxx11::
  basic_string<char,_std::char_traits<char>,_Jinx::StaticAllocator<char,_2048UL,_16UL>_>::_M_replace
            (&this->m_errorMessage,0,__len1,__s,__len2);
  return false;
}

Assistant:

inline_t bool VariableStackFrame::VariableAssign(const String & name)
	{
		// Sanity check
		if (m_frames.empty())
		{
			m_errorMessage = "Unexpected empty variable frame";
			return false;
		}

		// Retrieve the current frame data
		FrameData & frame = m_frames.back();
		if (frame.stack.empty())
		{
			m_errorMessage = "Attempting to assign a variable to an empty stack";
			return false;
		}

		// Work from the top of the stack down, and attempt to find an existing name
		for (auto ritr = frame.stack.rbegin(); ritr != frame.stack.rend(); ++ritr)
		{
			const auto & itr = ritr->find(name);
			if (itr != ritr->end())
				return true;
		}

		// If we don't find the name, create a new variable on the top of the stack
		auto & variableSet = frame.stack.back();
		variableSet.insert(name);

		// Adjust the max variable parts value if necessary
		size_t varParts = GetNamePartCount(name);
		if (varParts > GetMaxVariableParts())
			SetMaxVariableParts(varParts);

		return true;
	}